

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O2

void __thiscall FusionEKF::~FusionEKF(FusionEKF *this)

{
  ~FusionEKF(this);
  operator_delete(this);
  return;
}

Assistant:

FusionEKF::~FusionEKF() {}